

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_server.c
# Opt level: O0

void http_handle_redirect(nng_http *conn,void *data,nng_aio *aio)

{
  char *__s;
  undefined8 uVar1;
  int iVar2;
  nng_err result;
  char *__s1;
  size_t sVar3;
  char *uri;
  char *base;
  int rv;
  http_redirect *hr;
  char *loc;
  nng_aio *aio_local;
  void *data_local;
  nng_http *conn_local;
  
  hr = (http_redirect *)0x0;
  __s = *(char **)((long)data + 0x10);
  loc = (char *)aio;
  aio_local = (nng_aio *)data;
  data_local = conn;
  __s1 = nni_http_get_uri(conn);
  sVar3 = strlen(__s);
  iVar2 = strncmp(__s1,__s,sVar3);
  if (iVar2 == 0) {
    uVar1 = *(undefined8 *)((long)data + 8);
    sVar3 = strlen(__s);
    result = nni_asprintf((char **)&hr,"%s%s",uVar1,__s1 + sVar3);
    if (result != NNG_OK) {
      nni_aio_finish_error((nni_aio *)loc,result);
      return;
    }
  }
  else {
    hr = *(http_redirect **)((long)data + 8);
  }
  base._4_4_ = nni_http_set_redirect((nng_http *)data_local,*data,(char *)0x0,(char *)hr);
  if ((base._4_4_ == NNG_OK) &&
     (base._4_4_ = nni_http_set_header((nng_http *)data_local,"Connection","close"),
     base._4_4_ == NNG_OK)) {
    nng_http_set_status((nng_http *)data_local,*data,(char *)0x0);
    if (hr != *(http_redirect **)((long)data + 8)) {
      nni_strfree((char *)hr);
    }
    nni_aio_finish((nni_aio *)loc,NNG_OK,0);
  }
  else {
    if (hr != *(http_redirect **)((long)data + 8)) {
      nni_strfree((char *)hr);
    }
    nni_aio_finish_error((nni_aio *)loc,base._4_4_);
  }
  return;
}

Assistant:

static void
http_handle_redirect(nng_http *conn, void *data, nng_aio *aio)
{
	char          *loc = NULL;
	http_redirect *hr  = data;
	int            rv;
	const char    *base;
	const char    *uri;

	base = hr->from; // base uri
	uri  = nni_http_get_uri(conn);

	// If we are doing a full tree, then include the entire suffix.
	if (strncmp(uri, base, strlen(base)) == 0) {
		rv = nni_asprintf(&loc, "%s%s", hr->where, uri + strlen(base));
		if (rv != NNG_OK) {
			nni_aio_finish_error(aio, rv);
			return;
		}
	} else {
		loc = hr->where;
	}

	// Build a response.  We always close the connection for redirects,
	// because it is probably going to another server.  This also
	// keeps us from having to consume the entity body, we can just
	// discard it.
	if (((rv = nni_http_set_redirect(conn, hr->code, NULL, loc)) != 0) ||
	    ((rv = nni_http_set_header(conn, "Connection", "close")) != 0)) {
		if (loc != hr->where) {
			nni_strfree(loc);
		}
		nni_aio_finish_error(aio, rv);
		return;
	}

	nng_http_set_status(conn, hr->code, NULL);

	if (loc != hr->where) {
		nni_strfree(loc);
	}
	nni_aio_finish(aio, NNG_OK, 0);
}